

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O1

iterator cmOutputConverter::Shell_SkipMakeVariables(iterator c,iterator end)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  
  do {
    if (c == end) {
      return c;
    }
    if (c + 1 == end) {
      return c;
    }
    if (*c != '$') {
      return c;
    }
    if (c[1] != '(') {
      return c;
    }
    for (pcVar3 = c + 2; pcVar3 != end; pcVar3 = pcVar3 + 1) {
      cVar1 = *pcVar3;
      if ((cVar1 != '_') && ((cVar1 == '\0' || (iVar2 = isalpha((int)cVar1), iVar2 == 0)))) {
        bVar4 = cVar1 == ')';
        if (bVar4) {
          c = pcVar3 + 1;
        }
        goto LAB_0042a74b;
      }
    }
    bVar4 = false;
LAB_0042a74b:
    if (!bVar4) {
      return c;
    }
  } while( true );
}

Assistant:

cm::string_view::iterator cmOutputConverter::Shell_SkipMakeVariables(
  cm::string_view::iterator c, cm::string_view::iterator end)
{
  while ((c != end && (c + 1) != end) && (*c == '$' && *(c + 1) == '(')) {
    cm::string_view::iterator skip = c + 2;
    while ((skip != end) && Shell_CharIsMakeVariableName(*skip)) {
      ++skip;
    }
    if ((skip != end) && *skip == ')') {
      c = skip + 1;
    } else {
      break;
    }
  }
  return c;
}